

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_fcadds_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  uint uVar1;
  uint uVar2;
  float32 fVar3;
  float32 fVar4;
  ulong uVar5;
  uintptr_t i;
  ulong uVar6;
  
  uVar1 = (desc & 0x1f) * 8 + 8;
  uVar6 = (ulong)uVar1;
  for (uVar5 = 0; uVar5 < uVar1 >> 2; uVar5 = uVar5 + 2) {
    fVar4 = *(float32 *)((long)vn + uVar5 * 4 + 4);
    uVar2 = *(uint *)((long)vm + uVar5 * 4);
    fVar3 = float32_add_arm(*(float32 *)((long)vn + uVar5 * 4),
                            *(uint *)((long)vm + uVar5 * 4 + 4) ^ ~(desc >> 10) << 0x1f,
                            (float_status *)vfpst);
    *(float32 *)((long)vd + uVar5 * 4) = fVar3;
    fVar4 = float32_add_arm(fVar4,uVar2 ^ (desc >> 10) << 0x1f,(float_status *)vfpst);
    *(float32 *)((long)vd + uVar5 * 4 + 4) = fVar4;
  }
  for (; uVar6 < (desc >> 2 & 0xf8) + 8; uVar6 = uVar6 + 8) {
    *(undefined8 *)((long)vd + uVar6) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_fcadds)(void *vd, void *vn, void *vm,
                         void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float32 *d = vd;
    float32 *n = vn;
    float32 *m = vm;
    float_status *fpst = vfpst;
    uint32_t neg_real = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = neg_real ^ 1;
    uintptr_t i;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 31;
    neg_imag <<= 31;

    for (i = 0; i < opr_sz / 4; i += 2) {
        float32 e0 = n[H4(i)];
        float32 e1 = m[H4(i + 1)] ^ neg_imag;
        float32 e2 = n[H4(i + 1)];
        float32 e3 = m[H4(i)] ^ neg_real;

        d[H4(i)] = float32_add(e0, e1, fpst);
        d[H4(i + 1)] = float32_add(e2, e3, fpst);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}